

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::ExpandPaths(cmFindBase *this)

{
  cmFindBase *this_local;
  
  if (((this->super_cmFindCommon).NoDefaultPath & 1U) == 0) {
    if (((this->super_cmFindCommon).NoCMakePath & 1U) == 0) {
      FillCMakeVariablePath(this);
    }
    if (((this->super_cmFindCommon).NoCMakeEnvironmentPath & 1U) == 0) {
      FillCMakeEnvironmentPath(this);
    }
  }
  FillUserHintsPath(this);
  if (((this->super_cmFindCommon).NoDefaultPath & 1U) == 0) {
    if (((this->super_cmFindCommon).NoSystemEnvironmentPath & 1U) == 0) {
      FillSystemEnvironmentPath(this);
    }
    if (((this->super_cmFindCommon).NoCMakeSystemPath & 1U) == 0) {
      FillCMakeSystemVariablePath(this);
    }
  }
  FillUserGuessPath(this);
  return;
}

Assistant:

void cmFindBase::ExpandPaths()
{
  if(!this->NoDefaultPath)
    {
    if(!this->NoCMakePath)
      {
      this->FillCMakeVariablePath();
      }
    if(!this->NoCMakeEnvironmentPath)
      {
      this->FillCMakeEnvironmentPath();
      }
    }
  this->FillUserHintsPath();
  if(!this->NoDefaultPath)
    {
    if(!this->NoSystemEnvironmentPath)
      {
      this->FillSystemEnvironmentPath();
      }
    if(!this->NoCMakeSystemPath)
      {
      this->FillCMakeSystemVariablePath();
      }
    }
  this->FillUserGuessPath();
}